

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::printTestCaseAndSectionHeader(ConsoleReporter *this)

{
  pointer pSVar1;
  ostream *os;
  pointer pSVar2;
  size_t sVar3;
  ostream *poVar4;
  Colour colourGuard;
  SourceLineInfo lineInfo;
  char local_2a [2];
  SourceLineInfo local_28;
  
  printOpenHeader(this,&((this->super_StreamingReporterBase<Catch::ConsoleReporter>).
                         currentTestCaseInfo.super_Option<Catch::TestCaseInfo>.nullableValue)->name)
  ;
  pSVar2 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack.
           super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (1 < (ulong)(((long)pSVar2 -
                   (long)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack.
                         super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x3333333333333333)) {
    local_28.file = (char *)((ulong)local_28.file & 0xffffffffffffff00);
    Colour::use(Headers);
    pSVar2 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack.
             super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
             super__Vector_impl_data._M_start;
    pSVar1 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack.
             super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
    while (pSVar2 = pSVar2 + 1, pSVar2 != pSVar1) {
      printHeaderString(this,&pSVar2->name,2);
    }
    Colour::use(None);
    pSVar2 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack.
             super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  local_28.file = pSVar2[-1].lineInfo.file;
  local_28.line = pSVar2[-1].lineInfo.line;
  poVar4 = (ostream *)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam0000000000b55a40 = 0x2d2d2d2d2d2d2d;
    uRam0000000000b55a47._0_1_ = '-';
    uRam0000000000b55a47._1_1_ = '-';
    uRam0000000000b55a47._2_1_ = '-';
    uRam0000000000b55a47._3_1_ = '-';
    uRam0000000000b55a47._4_1_ = '-';
    uRam0000000000b55a47._5_1_ = '-';
    uRam0000000000b55a47._6_1_ = '-';
    uRam0000000000b55a47._7_1_ = '-';
    DAT_00b55a30 = '-';
    DAT_00b55a30_1._0_1_ = '-';
    DAT_00b55a30_1._1_1_ = '-';
    DAT_00b55a30_1._2_1_ = '-';
    DAT_00b55a30_1._3_1_ = '-';
    DAT_00b55a30_1._4_1_ = '-';
    DAT_00b55a30_1._5_1_ = '-';
    DAT_00b55a30_1._6_1_ = '-';
    uRam0000000000b55a38 = 0x2d2d2d2d2d2d2d;
    DAT_00b55a3f = 0x2d;
    DAT_00b55a20 = '-';
    DAT_00b55a20_1._0_1_ = '-';
    DAT_00b55a20_1._1_1_ = '-';
    DAT_00b55a20_1._2_1_ = '-';
    DAT_00b55a20_1._3_1_ = '-';
    DAT_00b55a20_1._4_1_ = '-';
    DAT_00b55a20_1._5_1_ = '-';
    DAT_00b55a20_1._6_1_ = '-';
    uRam0000000000b55a28._0_1_ = '-';
    uRam0000000000b55a28._1_1_ = '-';
    uRam0000000000b55a28._2_1_ = '-';
    uRam0000000000b55a28._3_1_ = '-';
    uRam0000000000b55a28._4_1_ = '-';
    uRam0000000000b55a28._5_1_ = '-';
    uRam0000000000b55a28._6_1_ = '-';
    uRam0000000000b55a28._7_1_ = '-';
    DAT_00b55a10 = '-';
    DAT_00b55a10_1._0_1_ = '-';
    DAT_00b55a10_1._1_1_ = '-';
    DAT_00b55a10_1._2_1_ = '-';
    DAT_00b55a10_1._3_1_ = '-';
    DAT_00b55a10_1._4_1_ = '-';
    DAT_00b55a10_1._5_1_ = '-';
    DAT_00b55a10_1._6_1_ = '-';
    uRam0000000000b55a18._0_1_ = '-';
    uRam0000000000b55a18._1_1_ = '-';
    uRam0000000000b55a18._2_1_ = '-';
    uRam0000000000b55a18._3_1_ = '-';
    uRam0000000000b55a18._4_1_ = '-';
    uRam0000000000b55a18._5_1_ = '-';
    uRam0000000000b55a18._6_1_ = '-';
    uRam0000000000b55a18._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam0000000000b55a08._0_1_ = '-';
    uRam0000000000b55a08._1_1_ = '-';
    uRam0000000000b55a08._2_1_ = '-';
    uRam0000000000b55a08._3_1_ = '-';
    uRam0000000000b55a08._4_1_ = '-';
    uRam0000000000b55a08._5_1_ = '-';
    uRam0000000000b55a08._6_1_ = '-';
    uRam0000000000b55a08._7_1_ = '-';
    DAT_00b55a4f = 0;
  }
  sVar3 = strlen(&getLineOfChars<(char)45>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,&getLineOfChars<(char)45>()::line,sVar3)
  ;
  local_2a[0] = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_2a,1);
  local_2a[1] = 0;
  Colour::use(FileName);
  os = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  Catch::operator<<(os,&local_28);
  local_2a[0] = '\n';
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,local_2a,1);
  poVar4 = (ostream *)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam0000000000b55ae0 = 0x2e2e2e2e2e2e2e;
    uRam0000000000b55ae7._0_1_ = '.';
    uRam0000000000b55ae7._1_1_ = '.';
    uRam0000000000b55ae7._2_1_ = '.';
    uRam0000000000b55ae7._3_1_ = '.';
    uRam0000000000b55ae7._4_1_ = '.';
    uRam0000000000b55ae7._5_1_ = '.';
    uRam0000000000b55ae7._6_1_ = '.';
    uRam0000000000b55ae7._7_1_ = '.';
    DAT_00b55ad0 = '.';
    DAT_00b55ad0_1._0_1_ = '.';
    DAT_00b55ad0_1._1_1_ = '.';
    DAT_00b55ad0_1._2_1_ = '.';
    DAT_00b55ad0_1._3_1_ = '.';
    DAT_00b55ad0_1._4_1_ = '.';
    DAT_00b55ad0_1._5_1_ = '.';
    DAT_00b55ad0_1._6_1_ = '.';
    uRam0000000000b55ad8 = 0x2e2e2e2e2e2e2e;
    DAT_00b55adf = 0x2e;
    DAT_00b55ac0 = '.';
    DAT_00b55ac0_1._0_1_ = '.';
    DAT_00b55ac0_1._1_1_ = '.';
    DAT_00b55ac0_1._2_1_ = '.';
    DAT_00b55ac0_1._3_1_ = '.';
    DAT_00b55ac0_1._4_1_ = '.';
    DAT_00b55ac0_1._5_1_ = '.';
    DAT_00b55ac0_1._6_1_ = '.';
    uRam0000000000b55ac8._0_1_ = '.';
    uRam0000000000b55ac8._1_1_ = '.';
    uRam0000000000b55ac8._2_1_ = '.';
    uRam0000000000b55ac8._3_1_ = '.';
    uRam0000000000b55ac8._4_1_ = '.';
    uRam0000000000b55ac8._5_1_ = '.';
    uRam0000000000b55ac8._6_1_ = '.';
    uRam0000000000b55ac8._7_1_ = '.';
    DAT_00b55ab0 = '.';
    DAT_00b55ab0_1._0_1_ = '.';
    DAT_00b55ab0_1._1_1_ = '.';
    DAT_00b55ab0_1._2_1_ = '.';
    DAT_00b55ab0_1._3_1_ = '.';
    DAT_00b55ab0_1._4_1_ = '.';
    DAT_00b55ab0_1._5_1_ = '.';
    DAT_00b55ab0_1._6_1_ = '.';
    uRam0000000000b55ab8._0_1_ = '.';
    uRam0000000000b55ab8._1_1_ = '.';
    uRam0000000000b55ab8._2_1_ = '.';
    uRam0000000000b55ab8._3_1_ = '.';
    uRam0000000000b55ab8._4_1_ = '.';
    uRam0000000000b55ab8._5_1_ = '.';
    uRam0000000000b55ab8._6_1_ = '.';
    uRam0000000000b55ab8._7_1_ = '.';
    getLineOfChars<(char)46>()::line = '.';
    getLineOfChars<(char)46>()::line_1._0_1_ = '.';
    getLineOfChars<(char)46>()::line_1._1_1_ = '.';
    getLineOfChars<(char)46>()::line_1._2_1_ = '.';
    getLineOfChars<(char)46>()::line_1._3_1_ = '.';
    getLineOfChars<(char)46>()::line_1._4_1_ = '.';
    getLineOfChars<(char)46>()::line_1._5_1_ = '.';
    getLineOfChars<(char)46>()::line_1._6_1_ = '.';
    uRam0000000000b55aa8._0_1_ = '.';
    uRam0000000000b55aa8._1_1_ = '.';
    uRam0000000000b55aa8._2_1_ = '.';
    uRam0000000000b55aa8._3_1_ = '.';
    uRam0000000000b55aa8._4_1_ = '.';
    uRam0000000000b55aa8._5_1_ = '.';
    uRam0000000000b55aa8._6_1_ = '.';
    uRam0000000000b55aa8._7_1_ = '.';
    DAT_00b55aef = 0;
  }
  sVar3 = strlen(&getLineOfChars<(char)46>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,&getLineOfChars<(char)46>()::line,sVar3)
  ;
  local_2a[0] = '\n';
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_2a,1);
  local_2a[0] = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_2a,1);
  Colour::use(None);
  return;
}

Assistant:

void ConsoleReporter::printTestCaseAndSectionHeader() {
    assert(!m_sectionStack.empty());
    printOpenHeader(currentTestCaseInfo->name);

    if (m_sectionStack.size() > 1) {
        Colour colourGuard(Colour::Headers);

        auto
            it = m_sectionStack.begin() + 1, // Skip first section (test case)
            itEnd = m_sectionStack.end();
        for (; it != itEnd; ++it)
            printHeaderString((*it).name, 2);
    }

    SourceLineInfo lineInfo = m_sectionStack.back().lineInfo;

    stream << getLineOfChars<'-'>() << '\n';
    Colour colourGuard(Colour::FileName);
    stream << lineInfo << '\n';
    stream << getLineOfChars<'.'>() << '\n' << '\n';
}